

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_args.cc
# Opt level: O3

vw * VW::initialize(string *s,io_buf *model,bool skipModelLoad,trace_message_t trace_listener,
                   void *trace_context)

{
  pointer pcVar1;
  int argc_00;
  char **argv;
  vw *pvVar2;
  int argc;
  int local_5c;
  void *local_58;
  string local_50;
  
  local_5c = 0;
  pcVar1 = (s->_M_dataplus)._M_p;
  local_58 = trace_context;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_50,pcVar1,pcVar1 + s->_M_string_length)
  ;
  argv = get_argv_from_string(&local_50,&local_5c);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  argc_00 = local_5c;
  pvVar2 = initialize(local_5c,argv,model,skipModelLoad,trace_listener,local_58);
  free_args(argc_00,argv);
  return pvVar2;
}

Assistant:

vw* initialize(string s, io_buf* model, bool skipModelLoad, trace_message_t trace_listener, void* trace_context)
{
  int argc = 0;
  char** argv = get_argv_from_string(s, argc);
  vw* ret = nullptr;

  try
  {
    ret = initialize(argc, argv, model, skipModelLoad, trace_listener, trace_context);
  }
  catch (...)
  {
    free_args(argc, argv);
    throw;
  }

  free_args(argc, argv);
  return ret;
}